

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzio.c
# Opt level: O0

int cm_zlib_gzread(gzFile file,voidp buf,uint len)

{
  uint uVar1;
  int iVar2;
  size_t sVar3;
  int *piVar4;
  uLong uVar5;
  uint local_44;
  Byte *pBStack_40;
  uInt n;
  Byte *next_out;
  Bytef *start;
  gz_stream *s;
  uint len_local;
  voidp buf_local;
  gzFile file_local;
  
  if ((file == (gzFile)0x0) || (*(char *)((long)file + 0xac) != 'r')) {
    file_local._4_4_ = -2;
  }
  else if ((*(int *)((long)file + 0x70) == -3) || (*(int *)((long)file + 0x70) == -1)) {
    file_local._4_4_ = -1;
  }
  else if (*(int *)((long)file + 0x70) == 1) {
    file_local._4_4_ = 0;
  }
  else {
    *(voidp *)((long)file + 0x18) = buf;
    *(uint *)((long)file + 0x20) = len;
    next_out = (Byte *)buf;
    pBStack_40 = (Byte *)buf;
    if ((*(int *)((long)file + 0x20) != 0) && (*(int *)((long)file + 200) != -1)) {
      *(char *)buf = (char)*(undefined4 *)((long)file + 200);
      *(long *)((long)file + 0x18) = *(long *)((long)file + 0x18) + 1;
      *(int *)((long)file + 0x20) = *(int *)((long)file + 0x20) + -1;
      *(undefined4 *)((long)file + 200) = 0xffffffff;
      *(long *)((long)file + 0xc0) = *(long *)((long)file + 0xc0) + 1;
      next_out = (Byte *)((long)buf + 1);
      pBStack_40 = next_out;
      if (*(int *)((long)file + 0xcc) != 0) {
        *(undefined4 *)((long)file + 0x70) = 1;
        return 1;
      }
    }
    while (*(int *)((long)file + 0x20) != 0) {
      if (*(int *)((long)file + 0xa8) != 0) {
        local_44 = *(uint *)((long)file + 8);
        if (*(uint *)((long)file + 0x20) < local_44) {
          local_44 = *(uint *)((long)file + 0x20);
        }
        if (local_44 != 0) {
          memcpy(*(void **)((long)file + 0x18),*file,(ulong)local_44);
          pBStack_40 = pBStack_40 + local_44;
          *(Byte **)((long)file + 0x18) = pBStack_40;
          *(ulong *)file = *file + (ulong)local_44;
          *(uint *)((long)file + 0x20) = *(int *)((long)file + 0x20) - local_44;
          *(uint *)((long)file + 8) = *(int *)((long)file + 8) - local_44;
        }
        if (*(int *)((long)file + 0x20) != 0) {
          sVar3 = fread(pBStack_40,1,(ulong)*(uint *)((long)file + 0x20),
                        *(FILE **)((long)file + 0x78));
          *(int *)((long)file + 0x20) = *(int *)((long)file + 0x20) - (int)sVar3;
        }
        uVar1 = len - *(int *)((long)file + 0x20);
        *(ulong *)((long)file + 0xb8) = (ulong)uVar1 + *(long *)((long)file + 0xb8);
        *(ulong *)((long)file + 0xc0) = (ulong)uVar1 + *(long *)((long)file + 0xc0);
        if (uVar1 != 0) {
          return uVar1;
        }
        *(undefined4 *)((long)file + 0x74) = 1;
        return 0;
      }
      if ((*(int *)((long)file + 8) == 0) && (*(int *)((long)file + 0x74) == 0)) {
        piVar4 = __errno_location();
        *piVar4 = 0;
        sVar3 = fread(*(void **)((long)file + 0x80),1,0x4000,*(FILE **)((long)file + 0x78));
        *(int *)((long)file + 8) = (int)sVar3;
        if (*(int *)((long)file + 8) == 0) {
          *(undefined4 *)((long)file + 0x74) = 1;
          iVar2 = ferror(*(FILE **)((long)file + 0x78));
          if (iVar2 != 0) {
            *(undefined4 *)((long)file + 0x70) = 0xffffffff;
            break;
          }
        }
        *(undefined8 *)file = *(undefined8 *)((long)file + 0x80);
      }
      *(ulong *)((long)file + 0xb8) =
           (ulong)*(uint *)((long)file + 8) + *(long *)((long)file + 0xb8);
      *(ulong *)((long)file + 0xc0) =
           (ulong)*(uint *)((long)file + 0x20) + *(long *)((long)file + 0xc0);
      iVar2 = cm_zlib_inflate((z_streamp_conflict)file,0);
      *(int *)((long)file + 0x70) = iVar2;
      *(ulong *)((long)file + 0xb8) =
           *(long *)((long)file + 0xb8) - (ulong)*(uint *)((long)file + 8);
      *(ulong *)((long)file + 0xc0) =
           *(long *)((long)file + 0xc0) - (ulong)*(uint *)((long)file + 0x20);
      if (*(int *)((long)file + 0x70) == 1) {
        uVar5 = cm_zlib_crc32(*(unsigned_long *)((long)file + 0x90),next_out,
                              (int)*(undefined8 *)((long)file + 0x18) - (int)next_out);
        *(uLong *)((long)file + 0x90) = uVar5;
        next_out = *(Byte **)((long)file + 0x18);
        uVar5 = getLong((gz_stream *)file);
        if (uVar5 == *(uLong *)((long)file + 0x90)) {
          getLong((gz_stream *)file);
          check_header((gz_stream *)file);
          if (*(int *)((long)file + 0x70) == 0) {
            cm_zlib_inflateReset((z_streamp_conflict)file);
            uVar5 = cm_zlib_crc32(0,(uchar *)0x0,0);
            *(uLong *)((long)file + 0x90) = uVar5;
          }
        }
        else {
          *(undefined4 *)((long)file + 0x70) = 0xfffffffd;
        }
      }
      if ((*(int *)((long)file + 0x70) != 0) || (*(int *)((long)file + 0x74) != 0)) break;
    }
    uVar5 = cm_zlib_crc32(*(unsigned_long *)((long)file + 0x90),next_out,
                          (int)*(undefined8 *)((long)file + 0x18) - (int)next_out);
    *(uLong *)((long)file + 0x90) = uVar5;
    if ((len == *(uint *)((long)file + 0x20)) &&
       ((*(int *)((long)file + 0x70) == -3 || (*(int *)((long)file + 0x70) == -1)))) {
      file_local._4_4_ = -1;
    }
    else {
      file_local._4_4_ = len - *(int *)((long)file + 0x20);
    }
  }
  return file_local._4_4_;
}

Assistant:

int ZEXPORT gzread (file, buf, len)
    gzFile file;
    voidp buf;
    unsigned len;
{
    gz_stream *s = (gz_stream*)file;
    Bytef *start = (Bytef*)buf; /* starting point for crc computation */
    Byte  *next_out; /* == stream.next_out but not forced far (for MSDOS) */

    if (s == NULL || s->mode != 'r') return Z_STREAM_ERROR;

    if (s->z_err == Z_DATA_ERROR || s->z_err == Z_ERRNO) return -1;
    if (s->z_err == Z_STREAM_END) return 0;  /* EOF */

    next_out = (Byte*)buf;
    s->stream.next_out = (Bytef*)buf;
    s->stream.avail_out = len;

    if (s->stream.avail_out && s->back != EOF) {
        *next_out++ = s->back;
        s->stream.next_out++;
        s->stream.avail_out--;
        s->back = EOF;
        s->out++;
        start++;
        if (s->last) {
            s->z_err = Z_STREAM_END;
            return 1;
        }
    }

    while (s->stream.avail_out != 0) {

        if (s->transparent) {
            /* Copy first the lookahead bytes: */
            uInt n = s->stream.avail_in;
            if (n > s->stream.avail_out) n = s->stream.avail_out;
            if (n > 0) {
                zmemcpy(s->stream.next_out, s->stream.next_in, n);
                next_out += n;
                s->stream.next_out = next_out;
                s->stream.next_in   += n;
                s->stream.avail_out -= n;
                s->stream.avail_in  -= n;
            }
            if (s->stream.avail_out > 0) {
                s->stream.avail_out -=
                    (uInt)fread(next_out, 1, s->stream.avail_out, s->file);
            }
            len -= s->stream.avail_out;
            s->in  += len;
            s->out += len;
            if (len == 0) s->z_eof = 1;
            return (int)len;
        }
        if (s->stream.avail_in == 0 && !s->z_eof) {

            errno = 0;
            s->stream.avail_in = (uInt)fread(s->inbuf, 1, Z_BUFSIZE, s->file);
            if (s->stream.avail_in == 0) {
                s->z_eof = 1;
                if (ferror(s->file)) {
                    s->z_err = Z_ERRNO;
                    break;
                }
            }
            s->stream.next_in = s->inbuf;
        }
        s->in += s->stream.avail_in;
        s->out += s->stream.avail_out;
        s->z_err = inflate(&(s->stream), Z_NO_FLUSH);
        s->in -= s->stream.avail_in;
        s->out -= s->stream.avail_out;

        if (s->z_err == Z_STREAM_END) {
            /* Check CRC and original size */
            s->crc = crc32(s->crc, start, (uInt)(s->stream.next_out - start));
            start = s->stream.next_out;

            if (getLong(s) != s->crc) {
                s->z_err = Z_DATA_ERROR;
            } else {
                (void)getLong(s);
                /* The uncompressed length returned by above getlong() may be
                 * different from s->out in case of concatenated .gz files.
                 * Check for such files:
                 */
                check_header(s);
                if (s->z_err == Z_OK) {
                    inflateReset(&(s->stream));
                    s->crc = crc32(0L, Z_NULL, 0);
                }
            }
        }
        if (s->z_err != Z_OK || s->z_eof) break;
    }
    s->crc = crc32(s->crc, start, (uInt)(s->stream.next_out - start));

    if (len == s->stream.avail_out &&
        (s->z_err == Z_DATA_ERROR || s->z_err == Z_ERRNO))
        return -1;
    return (int)(len - s->stream.avail_out);
}